

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

BOOL __thiscall
Js::JavascriptNativeFloatArray::DirectGetVarItemAt
          (JavascriptNativeFloatArray *this,uint32 index,Var *value,ScriptContext *requestContext)

{
  double dVar1;
  bool bVar2;
  BOOL BVar3;
  undefined1 *puVar4;
  double local_28;
  double dvalue;
  
  BVar3 = JavascriptArray::DirectGetItemAt<double>((JavascriptArray *)this,index,&local_28);
  dVar1 = local_28;
  if (BVar3 == 0) {
    BVar3 = 0;
  }
  else {
    puVar4 = &DAT_1000000000000;
    if (local_28 != 0.0) {
      if (((local_28 != (double)(int)local_28) || (NAN(local_28) || NAN((double)(int)local_28))) ||
         (bVar2 = NumberUtilities::IsSpecial(local_28,0x8000000000000000), bVar2)) {
        puVar4 = (undefined1 *)JavascriptNumber::ToVarWithCheck(local_28,requestContext);
      }
      else {
        puVar4 = (undefined1 *)((ulong)(uint)(int)dVar1 | 0x1000000000000);
      }
    }
    *value = puVar4;
    BVar3 = 1;
  }
  return BVar3;
}

Assistant:

BOOL JavascriptNativeFloatArray::DirectGetVarItemAt(uint32 index, Var *value, ScriptContext *requestContext)
    {
        double dvalue;
        int32 ivalue;
        if (!this->DirectGetItemAt<double>(index, &dvalue))
        {
            return FALSE;
        }
        if (*(uint64*)&dvalue == 0ull)
        {
            *value = TaggedInt::ToVarUnchecked(0);
        }
        else if (JavascriptNumber::TryGetInt32Value(dvalue, &ivalue) && !TaggedInt::IsOverflow(ivalue))
        {
            *value = TaggedInt::ToVarUnchecked(ivalue);
        }
        else
        {
            *value = JavascriptNumber::ToVarWithCheck(dvalue, requestContext);
        }
        return TRUE;
    }